

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_channel_map_find_channel_position
                    (ma_uint32 channels,ma_channel *pChannelMap,ma_channel channelPosition,
                    ma_uint32 *pChannelIndex)

{
  ma_channel mVar1;
  uint *in_RCX;
  ma_channel in_DL;
  uint in_EDI;
  ma_uint32 iChannel;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar2;
  
  if (in_RCX != (uint *)0x0) {
    *in_RCX = 0xffffffff;
  }
  uVar2 = 0;
  while( true ) {
    if (in_EDI <= uVar2) {
      return 0;
    }
    mVar1 = ma_channel_map_get_channel
                      ((ma_channel *)CONCAT44(uVar2,in_stack_ffffffffffffffd8),0,0x229d4f);
    if (mVar1 == in_DL) break;
    uVar2 = uVar2 + 1;
  }
  if (in_RCX != (uint *)0x0) {
    *in_RCX = uVar2;
  }
  return 1;
}

Assistant:

MA_API ma_bool32 ma_channel_map_find_channel_position(ma_uint32 channels, const ma_channel* pChannelMap, ma_channel channelPosition, ma_uint32* pChannelIndex)
{
    ma_uint32 iChannel;

    if (pChannelIndex != NULL) {
        *pChannelIndex = (ma_uint32)-1;
    }

    for (iChannel = 0; iChannel < channels; ++iChannel) {
        if (ma_channel_map_get_channel(pChannelMap, channels, iChannel) == channelPosition) {
            if (pChannelIndex != NULL) {
                *pChannelIndex = iChannel;
            }

            return MA_TRUE;
        }
    }

    /* Getting here means the channel position was not found. */
    return MA_FALSE;
}